

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# properties.h
# Opt level: O0

void __thiscall
gutil::Properties::getValue<gmath::SMatrix<double,3,3>>
          (Properties *this,char *key,SMatrix<double,_3,_3> *value,char *defvalue)

{
  byte bVar1;
  undefined8 uVar2;
  string *in_RSI;
  char *in_RDI;
  istringstream in;
  string v;
  SMatrix<double,_3,_3> *in_stack_fffffffffffffd88;
  allocator *__lhs;
  undefined7 in_stack_fffffffffffffd90;
  undefined1 in_stack_fffffffffffffd97;
  allocator local_251;
  string local_250 [8];
  string *in_stack_fffffffffffffdb8;
  IOException *in_stack_fffffffffffffdc0;
  istringstream local_1d0 [400];
  string local_40 [48];
  string *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::string::string(local_40);
  gutil::Properties::getString(in_RDI,local_10,(char *)local_40);
  std::__cxx11::istringstream::istringstream(local_1d0,local_40,_S_in);
  gmath::operator>>((basic_istream<char,_std::char_traits<char>_> *)
                    CONCAT17(in_stack_fffffffffffffd97,in_stack_fffffffffffffd90),
                    in_stack_fffffffffffffd88);
  bVar1 = std::ios::fail();
  if ((bVar1 & 1) == 0) {
    std::__cxx11::istringstream::~istringstream(local_1d0);
    std::__cxx11::string::~string(local_40);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  __lhs = &local_251;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,(char *)local_10,__lhs);
  std::operator+((char *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (char *)local_10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
  IOException::IOException(in_stack_fffffffffffffdc0,in_stack_fffffffffffffdb8);
  __cxa_throw(uVar2,&IOException::typeinfo,IOException::~IOException);
}

Assistant:

void getValue(const char *key, T &value,
                                     const char *defvalue=0) const
    {
      std::string v;

      getString(key, v, defvalue);

      std::istringstream in(v);
      in >> value;

      if (in.fail())
      {
        throw IOException("Format error: "+std::string(key)+"="+v);
      }
    }